

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atomic64_gcc_x86_64.h
# Opt level: O0

int64_t aeron::concurrent::atomic::getAndAddInt64(int64_t *address,int64_t value)

{
  int64_t iVar1;
  int64_t original;
  int64_t value_local;
  int64_t *address_local;
  
  LOCK();
  iVar1 = *address;
  *address = *address + value;
  UNLOCK();
  return iVar1;
}

Assistant:

inline std::int64_t getAndAddInt64(volatile std::int64_t* address, std::int64_t value)
{
    std::int64_t original;
    asm volatile(
        "lock; xaddq %0, %1"
        : "=r"(original), "+m"(*address)
        : "0"(value));
    return original;
}